

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

bool __thiscall CPU::Execute(CPU *this)

{
  uint8_t uVar1;
  
  if (this->cycles != 0) goto LAB_00103366;
  uVar1 = GetByte(this);
  switch(uVar1) {
  case '\0':
    BRK_IP(this);
    return true;
  case '\x01':
    ORA_ID_X(this);
    break;
  default:
    goto switchD_0010338e_caseD_2;
  case '\x05':
    ORA_ZP(this);
    break;
  case '\x06':
    ASL_ZP(this);
    break;
  case '\b':
    PHP_IP(this);
    break;
  case '\t':
    ORA_IM(this);
    break;
  case '\n':
    ASL_AC(this);
    break;
  case '\r':
    ORA_AB(this);
    break;
  case '\x0e':
    ASL_AB(this);
    break;
  case '\x10':
    BPL_RL(this);
    break;
  case '\x11':
    ORA_ID_Y(this);
    break;
  case '\x15':
    ORA_ZP_X(this);
    break;
  case '\x16':
    ASL_ZP_X(this);
    break;
  case '\x18':
    (this->field_6).ps = (this->field_6).ps & 0xfe;
    goto switchD_0010338e_caseD_2;
  case '\x19':
    ORA_AB_Y(this);
    break;
  case '\x1d':
    ORA_AB_X(this);
    break;
  case '\x1e':
    ASL_AB_X(this);
    break;
  case ' ':
    JSR_AB(this);
    break;
  case '!':
    AND_ID_X(this);
    break;
  case '$':
    BIT_ZP(this);
    break;
  case '%':
    AND_ZP(this);
    break;
  case '&':
    ROL_ZP(this);
    break;
  case '(':
    PLP_IP(this);
    break;
  case ')':
    AND_IM(this);
    break;
  case '*':
    ROL_AC(this);
    break;
  case ',':
    BIT_AB(this);
    break;
  case '-':
    AND_AB(this);
    break;
  case '.':
    ROL_AB(this);
    break;
  case '0':
    BMI_RL(this);
    break;
  case '1':
    AND_ID_Y(this);
    break;
  case '5':
    AND_ZP_X(this);
    break;
  case '6':
    ROL_ZP_X(this);
    break;
  case '8':
    (this->field_6).ps = (this->field_6).ps | 1;
    goto switchD_0010338e_caseD_2;
  case '9':
    AND_AB_Y(this);
    break;
  case '=':
    AND_AB_X(this);
    break;
  case '>':
    ROL_AB_X(this);
    break;
  case '@':
    RTI_IP(this);
    break;
  case 'A':
    EOR_ID_X(this);
    break;
  case 'E':
    EOR_ZP(this);
    break;
  case 'F':
    LSR_ZP(this);
    break;
  case 'H':
    PHA_IP(this);
    break;
  case 'I':
    EOR_IM(this);
    break;
  case 'J':
    LSR_AC(this);
    break;
  case 'L':
    JMP_AB(this);
    break;
  case 'M':
    EOR_AB(this);
    break;
  case 'N':
    LSR_AB(this);
    break;
  case 'P':
    BVC_RL(this);
    break;
  case 'Q':
    EOR_ID_Y(this);
    break;
  case 'U':
    EOR_ZP_X(this);
    break;
  case 'V':
    LSR_ZP_X(this);
    break;
  case 'X':
    (this->field_6).ps = (this->field_6).ps & 0xfb;
    goto switchD_0010338e_caseD_2;
  case 'Y':
    EOR_AB_Y(this);
    break;
  case ']':
    EOR_AB_X(this);
    break;
  case '^':
    LSR_AB_X(this);
    break;
  case '`':
    RTS_IP(this);
    break;
  case 'a':
    ADC_ID_X(this);
    break;
  case 'e':
    ADC_ZP(this);
    break;
  case 'f':
    ROR_ZP(this);
    break;
  case 'h':
    PLA_IP(this);
    break;
  case 'i':
    ADC_IM(this);
    break;
  case 'j':
    ROR_AC(this);
    break;
  case 'l':
    JMP_ID(this);
    break;
  case 'm':
    ADC_AB(this);
    break;
  case 'n':
    ROR_AB(this);
    break;
  case 'p':
    BVS_RL(this);
    break;
  case 'q':
    ADC_ID_Y(this);
    break;
  case 'u':
    ADC_ZP_X(this);
    break;
  case 'v':
    ROR_ZP_X(this);
    break;
  case 'x':
    (this->field_6).ps = (this->field_6).ps | 4;
    goto switchD_0010338e_caseD_2;
  case 'y':
    ADC_AB_Y(this);
    break;
  case '}':
    ADC_AB_X(this);
    break;
  case '~':
    ROR_AB_X(this);
    break;
  case 0x81:
    STA_ID_X(this);
    break;
  case 0x84:
    STY_ZP(this);
    break;
  case 0x85:
    STA_ZP(this);
    break;
  case 0x86:
    STX_ZP(this);
    break;
  case 0x88:
    DEY_IP(this);
    break;
  case 0x8a:
    TXA_IP(this);
    break;
  case 0x8c:
    STY_AB(this);
    break;
  case 0x8d:
    STA_AB(this);
    break;
  case 0x8e:
    STX_AB(this);
    break;
  case 0x90:
    BCC_RL(this);
    break;
  case 0x91:
    STA_ID_Y(this);
    break;
  case 0x94:
    STY_ZP_X(this);
    break;
  case 0x95:
    STA_ZP_X(this);
    break;
  case 0x96:
    STX_ZP_Y(this);
    break;
  case 0x98:
    TYA_IP(this);
    break;
  case 0x99:
    STA_AB_Y(this);
    break;
  case 0x9a:
    this->sp = this->X;
    goto switchD_0010338e_caseD_2;
  case 0x9d:
    STA_AB_X(this);
    break;
  case 0xa0:
    LDY_IM(this);
    break;
  case 0xa1:
    LDA_ID_X(this);
    break;
  case 0xa2:
    LDX_IM(this);
    break;
  case 0xa4:
    LDY_ZP(this);
    break;
  case 0xa5:
    LDA_ZP(this);
    break;
  case 0xa6:
    LDX_ZP(this);
    break;
  case 0xa8:
    TAY_IP(this);
    break;
  case 0xa9:
    LDA_IM(this);
    break;
  case 0xaa:
    TAX_IP(this);
    break;
  case 0xac:
    LDY_AB(this);
    break;
  case 0xad:
    LDA_AB(this);
    break;
  case 0xae:
    LDX_AB(this);
    break;
  case 0xb0:
    BCS_RL(this);
    break;
  case 0xb1:
    LDA_ID_Y(this);
    break;
  case 0xb4:
    LDY_ZP_X(this);
    break;
  case 0xb5:
    LDA_ZP_X(this);
    break;
  case 0xb6:
    LDX_ZP_Y(this);
    break;
  case 0xb8:
    (this->field_6).ps = (this->field_6).ps & 0xbf;
    goto switchD_0010338e_caseD_2;
  case 0xb9:
    LDA_AB_Y(this);
    break;
  case 0xba:
    TSX_IP(this);
    break;
  case 0xbc:
    LDY_AB_X(this);
    break;
  case 0xbd:
    LDA_AB_X(this);
    break;
  case 0xbe:
    LDX_AB_Y(this);
    break;
  case 0xc0:
    CPY_IM(this);
    break;
  case 0xc1:
    CMP_ID_X(this);
    break;
  case 0xc4:
    CPY_ZP(this);
    break;
  case 0xc5:
    CMP_ZP(this);
    break;
  case 0xc6:
    DEC_ZP(this);
    break;
  case 200:
    INY_IP(this);
    break;
  case 0xc9:
    CMP_IM(this);
    break;
  case 0xca:
    DEX_IP(this);
    break;
  case 0xcc:
    CPY_AB(this);
    break;
  case 0xcd:
    CMP_AB(this);
    break;
  case 0xce:
    DEC_AB(this);
    break;
  case 0xd0:
    BNE_RL(this);
    break;
  case 0xd1:
    CMP_ID_Y(this);
    break;
  case 0xd5:
    CMP_ZP_X(this);
    break;
  case 0xd6:
    DEC_ZP_X(this);
    break;
  case 0xd8:
    (this->field_6).ps = (this->field_6).ps & 0xf7;
    goto switchD_0010338e_caseD_2;
  case 0xd9:
    CMP_AB_Y(this);
    break;
  case 0xdd:
    CMP_AB_X(this);
    break;
  case 0xde:
    DEC_AB_X(this);
    break;
  case 0xe0:
    CPX_IM(this);
    break;
  case 0xe1:
    SBC_ID_X(this);
    break;
  case 0xe4:
    CPX_ZP(this);
    break;
  case 0xe5:
    SBC_ZP(this);
    break;
  case 0xe6:
    INC_ZP(this);
    break;
  case 0xe8:
    INX_IP(this);
    break;
  case 0xe9:
    SBC_IM(this);
    break;
  case 0xec:
    CPX_AB(this);
    break;
  case 0xed:
    SBC_AB(this);
    break;
  case 0xee:
    INC_AB(this);
    break;
  case 0xf0:
    BEQ_RL(this);
    break;
  case 0xf1:
    SBC_ID_Y(this);
    break;
  case 0xf5:
    SBC_ZP_X(this);
    break;
  case 0xf6:
    INC_ZP_X(this);
    break;
  case 0xf8:
    (this->field_6).ps = (this->field_6).ps | 8;
switchD_0010338e_caseD_2:
    this->cycles = 1;
    break;
  case 0xf9:
    SBC_AB_Y(this);
    break;
  case 0xfd:
    SBC_AB_X(this);
    break;
  case 0xfe:
    INC_AB_X(this);
  }
LAB_00103366:
  this->cycles = this->cycles - 1;
  return false;
}

Assistant:

bool CPU::Execute() 
{
    if(cycles == 0)
    {
        uint8_t ins = GetByte();
        switch(ins)
        {   
        // LDA - Load accumulator
        case 0xA9: LDA_IM(); break;
        case 0xA5: LDA_ZP(); break;
        case 0xB5: LDA_ZP_X(); break;
        case 0xAD: LDA_AB(); break;
        case 0xBD: LDA_AB_X(); break;
        case 0xB9: LDA_AB_Y(); break;
        case 0xA1: LDA_ID_X(); break;
        case 0xB1: LDA_ID_Y(); break;
        // LDX - Load X Register
        case 0xA2: LDX_IM(); break;
        case 0xA6: LDX_ZP(); break;
        case 0xB6: LDX_ZP_Y(); break;
        case 0xAE: LDX_AB(); break;
        case 0xBE: LDX_AB_Y(); break;
        // LDY - Load Y Register
        case 0xA0: LDY_IM(); break;
        case 0xA4: LDY_ZP(); break;
        case 0xB4: LDY_ZP_X(); break;
        case 0xAC: LDY_AB(); break;
        case 0xBC: LDY_AB_X(); break;
        // STA - Store accumulator
        case 0x85: STA_ZP(); break;
        case 0x95: STA_ZP_X(); break;
        case 0x8D: STA_AB(); break;
        case 0x9D: STA_AB_X(); break;
        case 0x99: STA_AB_Y(); break;
        case 0x81: STA_ID_X(); break;
        case 0x91: STA_ID_Y(); break;
        // STX - Store X register
        case 0x86: STX_ZP(); break;
        case 0x96: STX_ZP_Y(); break;
        case 0x8E: STX_AB(); break;
        // STY - Store Y register
        case 0x84: STY_ZP(); break;
        case 0x94: STY_ZP_X(); break;
        case 0x8C: STY_AB(); break;
        // JSR - Jump to subroutine
        case 0x20: JSR_AB(); break;
        // RTS - Return from subroutine
        case 0x60: RTS_IP(); break;
        // JMP - Jump to another location
        case 0x4C: JMP_AB(); break;
        case 0x6C: JMP_ID(); break;
        // Register transfers 
        case 0xAA: TAX_IP(); break;
        case 0xA8: TAY_IP(); break;
        case 0x8A: TXA_IP(); break;
        case 0x98: TYA_IP(); break;
        // Stack operations
        case 0xBA: TSX_IP(); break;
        case 0x9A: TXS_IP(); break;
        case 0x48: PHA_IP(); break;
        case 0x68: PLA_IP(); break;
        case 0x08: PHP_IP(); break;
        case 0x28: PLP_IP(); break;
        // Status flag changes
        case 0x18: CLC_IP(); break;
        case 0xD8: CLD_IP(); break;
        case 0x58: CLI_IP(); break;
        case 0xB8: CLV_IP(); break;
        case 0x38: SEC_IP(); break;
        case 0xF8: SED_IP(); break;
        case 0x78: SEI_IP(); break;
        // AND - Logical and
        case 0x29: AND_IM(); break;
        case 0x25: AND_ZP(); break;
        case 0x35: AND_ZP_X(); break;
        case 0x2D: AND_AB(); break;
        case 0x3D: AND_AB_X(); break;
        case 0x39: AND_AB_Y(); break;
        case 0x21: AND_ID_X(); break;
        case 0x31: AND_ID_Y(); break;
        // ORA - Logical inclusive or
        case 0x09: ORA_IM(); break;
        case 0x05: ORA_ZP(); break;
        case 0x15: ORA_ZP_X(); break;
        case 0x0D: ORA_AB(); break;
        case 0x1D: ORA_AB_X(); break;
        case 0x19: ORA_AB_Y(); break;
        case 0x01: ORA_ID_X(); break;
        case 0x11: ORA_ID_Y(); break;
        // EOR - Logical exclusive or
        case 0x49: EOR_IM(); break;
        case 0x45: EOR_ZP(); break;
        case 0x55: EOR_ZP_X(); break;
        case 0x4D: EOR_AB(); break;
        case 0x5D: EOR_AB_X(); break;
        case 0x59: EOR_AB_Y(); break;
        case 0x41: EOR_ID_X(); break;
        case 0x51: EOR_ID_Y(); break;
        // BIT - Bit test
        case 0x24: BIT_ZP(); break;
        case 0x2C: BIT_AB(); break;
        // Increments and decrements
        case 0xE6: INC_ZP(); break;
        case 0xF6: INC_ZP_X(); break;
        case 0xEE: INC_AB(); break;
        case 0xFE: INC_AB_X(); break;
        case 0xE8: INX_IP(); break;
        case 0xC8: INY_IP(); break;
        case 0xC6: DEC_ZP(); break;
        case 0xD6: DEC_ZP_X(); break;
        case 0xCE: DEC_AB(); break;
        case 0xDE: DEC_AB_X(); break;
        case 0xCA: DEX_IP(); break;
        case 0x88: DEY_IP(); break;
        // Branches
        case 0x90: BCC_RL(); break;
        case 0xB0: BCS_RL(); break;
        case 0xD0: BNE_RL(); break;
        case 0xF0: BEQ_RL(); break;
        case 0x10: BPL_RL(); break;
        case 0x30: BMI_RL(); break;
        case 0x50: BVC_RL(); break;
        case 0x70: BVS_RL(); break;
        // ADC - Add with carry
        case 0x69: ADC_IM(); break;
        case 0x65: ADC_ZP(); break;
        case 0x75: ADC_ZP_X(); break;
        case 0x6D: ADC_AB(); break;
        case 0x7D: ADC_AB_X(); break;
        case 0x79: ADC_AB_Y(); break;
        case 0x61: ADC_ID_X(); break;
        case 0x71: ADC_ID_Y(); break;
        // SBC - Subtract with carry
        case 0xE9: SBC_IM(); break;
        case 0xE5: SBC_ZP(); break;
        case 0xF5: SBC_ZP_X(); break;
        case 0xED: SBC_AB(); break;
        case 0xFD: SBC_AB_X(); break;
        case 0xF9: SBC_AB_Y(); break;
        case 0xE1: SBC_ID_X(); break;
        case 0xF1: SBC_ID_Y(); break;
        // CMP - Compare accumulator
        case 0xC9: CMP_IM(); break;
        case 0xC5: CMP_ZP(); break;
        case 0xD5: CMP_ZP_X(); break;
        case 0xCD: CMP_AB(); break;
        case 0xDD: CMP_AB_X(); break;
        case 0xD9: CMP_AB_Y(); break;
        case 0xC1: CMP_ID_X(); break;
        case 0xD1: CMP_ID_Y(); break;
        // CPX - Compare X register
        case 0xE0: CPX_IM(); break;
        case 0xE4: CPX_ZP(); break;
        case 0xEC: CPX_AB(); break;
        // CPY - Compare Y register
        case 0xC0: CPY_IM(); break;
        case 0xC4: CPY_ZP(); break;
        case 0xCC: CPY_AB(); break;
        // ASL - Arithmetic shift left
        case 0x0A: ASL_AC(); break;
        case 0x06: ASL_ZP(); break;
        case 0x16: ASL_ZP_X(); break;
        case 0x0E: ASL_AB(); break;
        case 0x1E: ASL_AB_X(); break;
        // LSR - Logical shift right
        case 0x4A: LSR_AC(); break;
        case 0x46: LSR_ZP(); break;
        case 0x56: LSR_ZP_X(); break;
        case 0x4E: LSR_AB(); break;
        case 0x5E: LSR_AB_X(); break;
        // ROL - Rotate left
        case 0x2A: ROL_AC(); break;
        case 0x26: ROL_ZP(); break;
        case 0x36: ROL_ZP_X(); break;
        case 0x2E: ROL_AB(); break;
        case 0x3E: ROL_AB_X(); break;
        // ROR - Rotate right
        case 0x6A: ROR_AC(); break;
        case 0x66: ROR_ZP(); break;
        case 0x76: ROR_ZP_X(); break;
        case 0x6E: ROR_AB(); break;
        case 0x7E: ROR_AB_X(); break;
        // System functions
        case 0x00: BRK_IP(); return 1;
        case 0xEA: NOP_IP(); break;
        case 0x40: RTI_IP(); break;

        default: cycles = 1;
        }           
    }
    cycles--;

    return 0;
}